

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O0

void run_ops(uint64_t ops,rng_t *rng,uint64_t *lat,void *get_buffer)

{
  long lVar1;
  FILE *__stream;
  char *pcVar2;
  uint64_t *state;
  int iVar3;
  uint64_t uVar4;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  char *key;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auStack_88 [8];
  FILE *local_80;
  uint64_t local_78;
  double local_70;
  char *local_68;
  ulong local_60;
  uint64_t size;
  unsigned_long __vla_expr0;
  uint64_t local_48;
  uint64_t obj;
  uint64_t count;
  uint64_t opt_tag;
  uint64_t opt;
  void *get_buffer_local;
  uint64_t *lat_local;
  rng_t *rng_local;
  uint64_t ops_local;
  
  obj = 0;
  puVar8 = auStack_88;
  opt = (uint64_t)get_buffer;
  get_buffer_local = lat;
  lat_local = *rng;
  rng_local = (rng_t *)ops;
  do {
    state = lat_local;
    if (rng_local <= obj) {
      return;
    }
    *(undefined8 *)(puVar8 + -8) = 0x104cea;
    uVar4 = rnd64_r((rng_t *)state);
    *(undefined8 *)(puVar8 + -8) = 0x104cf8;
    uVar4 = n_lowest_bits(uVar4,(int)key_diversity);
    size = key_size + 1;
    lVar1 = -(key_size + 0x10 & 0xfffffffffffffff0);
    key = puVar8 + lVar1;
    local_48 = uVar4;
    __vla_expr0 = (unsigned_long)puVar8;
    local_68 = key;
    builtin_strncpy(puVar8 + lVar1 + -8,"2M\x10",4);
    key[-4] = '\0';
    key[-3] = '\0';
    key[-2] = '\0';
    key[-1] = '\0';
    fill_key(key,uVar4);
    if (get_buffer_local != (void *)0x0) {
      builtin_strncpy(puVar8 + lVar1 + -8,">M\x10",4);
      key[-4] = '\0';
      key[-3] = '\0';
      key[-2] = '\0';
      key[-1] = '\0';
      opt_tag = getticks();
    }
    uVar4 = opt;
    pcVar2 = local_68;
    key[-0x10] = '\0';
    key[-0xf] = '\0';
    key[-0xe] = '\0';
    key[-0xd] = '\0';
    key[-0xc] = '\0';
    key[-0xb] = '\0';
    key[-10] = '\0';
    key[-9] = '\0';
    builtin_strncpy(puVar8 + lVar1 + -0x18,"uM\x10",4);
    key[-0x14] = '\0';
    key[-0x13] = '\0';
    key[-0x12] = '\0';
    key[-0x11] = '\0';
    lVar5 = vmemcache_get(cache,pcVar2,key_size,uVar4,get_size,0);
    if (lVar5 < 0) {
      local_78 = min_size;
      lVar5 = (max_size - min_size) + 1;
      auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = 0x45300000;
      local_70 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
      uVar9 = local_48 ^ vsize_seed;
      key[-8] = -0x26;
      key[-7] = 'M';
      key[-6] = '\x10';
      key[-5] = '\0';
      key[-4] = '\0';
      key[-3] = '\0';
      key[-2] = '\0';
      key[-1] = '\0';
      uVar4 = hash64(uVar9);
      key[-8] = -0x1e;
      key[-7] = 'M';
      key[-6] = '\x10';
      key[-5] = '\0';
      key[-4] = '\0';
      key[-3] = '\0';
      key[-2] = '\0';
      key[-1] = '\0';
      dVar10 = rndlength(uVar4);
      pcVar2 = local_68;
      uVar9 = (ulong)(local_70 * dVar10);
      uVar9 = local_78 +
              (uVar9 | (long)(local_70 * dVar10 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f);
      local_60 = uVar9;
      if ((uVar9 < min_size) || (max_size < uVar9)) {
        builtin_strncpy(puVar8 + lVar1 + -8,"fN\x10",4);
        key[-4] = '\0';
        key[-3] = '\0';
        key[-2] = '\0';
        key[-1] = '\0';
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                ,0x176,"run_ops");
        uVar9 = local_60;
        key[-8] = -0x70;
        key[-7] = 'N';
        key[-6] = '\x10';
        key[-5] = '\0';
        key[-4] = '\0';
        key[-3] = '\0';
        key[-2] = '\0';
        key[-1] = '\0';
        fprintf(_stderr,"ASSERT FAILED : size = %llu not in [%llu,%llu]",uVar9,min_size,max_size);
        key[-8] = -0x58;
        key[-7] = 'N';
        key[-6] = '\x10';
        key[-5] = '\0';
        key[-4] = '\0';
        key[-3] = '\0';
        key[-2] = '\0';
        key[-1] = '\0';
        fprintf(_stderr,"\n");
        key[-8] = -0x53;
        key[-7] = 'N';
        key[-6] = '\x10';
        key[-5] = '\0';
        key[-4] = '\0';
        key[-3] = '\0';
        key[-2] = '\0';
        key[-1] = '\0';
        abort();
      }
      key[-8] = -0x2d;
      key[-7] = 'N';
      key[-6] = '\x10';
      key[-5] = '\0';
      key[-4] = '\0';
      key[-3] = '\0';
      key[-2] = '\0';
      key[-1] = '\0';
      iVar3 = vmemcache_put(cache,pcVar2,key_size,lotta_zeroes,uVar9);
      if (iVar3 != 0) {
        key[-8] = -0x1f;
        key[-7] = 'N';
        key[-6] = '\x10';
        key[-5] = '\0';
        key[-4] = '\0';
        key[-3] = '\0';
        key[-2] = '\0';
        key[-1] = '\0';
        piVar6 = __errno_location();
        if (*piVar6 != 0x11) {
          key[-8] = -0xe;
          key[-7] = 'N';
          key[-6] = '\x10';
          key[-5] = '\0';
          key[-4] = '\0';
          key[-3] = '\0';
          key[-2] = '\0';
          key[-1] = '\0';
          print_stats(cache);
          builtin_strncpy(puVar8 + lVar1 + -8,"\x1dO\x10",4);
          key[-4] = '\0';
          key[-3] = '\0';
          key[-2] = '\0';
          key[-1] = '\0';
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0x17c,"run_ops");
          local_80 = _stderr;
          builtin_strncpy(puVar8 + lVar1 + -8,"0O\x10",4);
          key[-4] = '\0';
          key[-3] = '\0';
          key[-2] = '\0';
          key[-1] = '\0';
          uVar7 = vmemcache_errormsg();
          __stream = local_80;
          builtin_strncpy(puVar8 + lVar1 + -8,"EO\x10",4);
          key[-4] = '\0';
          key[-3] = '\0';
          key[-2] = '\0';
          key[-1] = '\0';
          fprintf(__stream,"vmemcache_put failed: %s",uVar7);
          builtin_strncpy(puVar8 + lVar1 + -8,"]O\x10",4);
          key[-4] = '\0';
          key[-3] = '\0';
          key[-2] = '\0';
          key[-1] = '\0';
          fprintf(_stderr,"\n");
          builtin_strncpy(puVar8 + lVar1 + -8,"bO\x10",4);
          key[-4] = '\0';
          key[-3] = '\0';
          key[-2] = '\0';
          key[-1] = '\0';
          abort();
        }
      }
      count = 0x8000000000000000;
    }
    else {
      count = 0;
    }
    if (get_buffer_local != (void *)0x0) {
      key[-8] = -0x7a;
      key[-7] = 'O';
      key[-6] = '\x10';
      key[-5] = '\0';
      key[-4] = '\0';
      key[-3] = '\0';
      key[-2] = '\0';
      key[-1] = '\0';
      uVar4 = getticks();
      *(uint64_t *)get_buffer_local = uVar4 - opt_tag | count;
      get_buffer_local = (void *)((long)get_buffer_local + 8);
    }
    obj = obj + 1;
    puVar8 = (undefined1 *)__vla_expr0;
  } while( true );
}

Assistant:

static void
run_ops(uint64_t ops, rng_t *rng, uint64_t *lat, void *get_buffer)
{
	uint64_t opt, opt_tag;

	for (uint64_t count = 0; count < ops; count++) {
		uint64_t obj = n_lowest_bits(rnd64_r(rng), (int)key_diversity);

		char key[key_size + 1];
		fill_key(key, obj);

		if (lat)
			opt = getticks();

		if (vmemcache_get(cache, key, key_size, get_buffer, get_size, 0,
			NULL) < 0) {

			uint64_t size = min_size
				+ (uint64_t)((double)(max_size - min_size + 1)
				* rndlength(hash64(obj ^ vsize_seed)));
			UT_ASSERTin(size, min_size, max_size);

			if (vmemcache_put(cache, key, key_size, lotta_zeroes,
				size) && errno != EEXIST) {
				print_stats(cache);
				UT_FATAL("vmemcache_put failed: %s",
						vmemcache_errormsg());
			}

			opt_tag = PUT_TAG;
		} else {
			opt_tag = 0;
		}

		if (lat)
			*lat++ = (getticks() - opt) | opt_tag;
	}
}